

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void cppcms::json::traits<char[35]>::set(value *v,vtype *in)

{
  size_t sVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar1 = strlen(*in);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,in,*in + sVar1);
  json::value::str(v,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void set(value &v,vtype const &in)
		{					
			v.str(in);
		}